

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::TraverseSchema::processBaseTypeInfo
          (TraverseSchema *this,DOMElement *elem,XMLCh *baseName,XMLCh *localPart,XMLCh *uriStr,
          ComplexTypeInfo *typeInfo)

{
  SchemaInfo *this_00;
  ValueVectorOf<unsigned_int> *pVVar1;
  RefHashTableOf<xercesc_4_0::ComplexTypeInfo,_xercesc_4_0::StringHasher> *this_01;
  bool bVar2;
  uint uVar3;
  int iVar4;
  undefined4 *puVar5;
  DOMElement *pDVar6;
  undefined4 extraout_var;
  int baseTypeSymbol;
  DOMElement *baseTypeNode;
  XMLCh *local_70;
  XMLCh *fullBaseName;
  SchemaInfo *impInfo;
  uint local_58;
  uint uriId;
  uint saveScope;
  ListType infoType;
  DatatypeValidator *baseDTValidator;
  ComplexTypeInfo *baseComplexTypeInfo;
  SchemaInfo *saveInfo;
  ComplexTypeInfo *typeInfo_local;
  XMLCh *uriStr_local;
  XMLCh *localPart_local;
  XMLCh *baseName_local;
  DOMElement *elem_local;
  TraverseSchema *this_local;
  
  baseComplexTypeInfo = (ComplexTypeInfo *)this->fSchemaInfo;
  baseDTValidator = (DatatypeValidator *)0x0;
  _saveScope = (DatatypeValidator *)0x0;
  uriId = 2;
  local_58 = this->fCurrentScope;
  saveInfo = (SchemaInfo *)typeInfo;
  typeInfo_local = (ComplexTypeInfo *)uriStr;
  uriStr_local = localPart;
  localPart_local = baseName;
  baseName_local = (XMLCh *)elem;
  elem_local = (DOMElement *)this;
  bVar2 = XMLString::equals(uriStr,this->fTargetNSURIString);
  if (bVar2) {
    XMLBuffer::set(&this->fBuffer,(XMLCh *)typeInfo_local);
    XMLBuffer::append(&this->fBuffer,L',');
    XMLBuffer::append(&this->fBuffer,uriStr_local);
    local_70 = XMLBuffer::getRawBuffer(&this->fBuffer);
    baseDTValidator =
         (DatatypeValidator *)
         RefHashTableOf<xercesc_4_0::ComplexTypeInfo,_xercesc_4_0::StringHasher>::get
                   (this->fComplexTypeRegistry,local_70);
    if ((ComplexTypeInfo *)baseDTValidator != (ComplexTypeInfo *)0x0) {
      pVVar1 = this->fCurrentTypeNameStack;
      baseTypeNode._4_4_ =
           (*(this->fStringPool->super_XSerializable)._vptr_XSerializable[5])
                     (this->fStringPool,local_70);
      bVar2 = ValueVectorOf<unsigned_int>::containsElement
                        (pVVar1,(uint *)((long)&baseTypeNode + 4),this->fCircularCheckIndex);
      if (bVar2) {
        reportSchemaError(this,(DOMElement *)baseName_local,(XMLCh *)XMLUni::fgXMLErrDomain,0x56,
                          local_70,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
        puVar5 = (undefined4 *)__cxa_allocate_exception(4);
        *puVar5 = 1;
        __cxa_throw(puVar5,&ExceptionCodes::typeinfo,0);
      }
      pVVar1 = this->fCurrentTypeNameStack;
      baseTypeNode._0_4_ =
           (*(this->fStringPool->super_XSerializable)._vptr_XSerializable[5])
                     (this->fStringPool,local_70);
      bVar2 = ValueVectorOf<unsigned_int>::containsElement(pVVar1,(uint *)&baseTypeNode,0);
      if (bVar2) {
        ComplexTypeInfo::setBaseComplexTypeInfo
                  ((ComplexTypeInfo *)saveInfo,(ComplexTypeInfo *)baseDTValidator);
        puVar5 = (undefined4 *)__cxa_allocate_exception(4);
        *puVar5 = 2;
        __cxa_throw(puVar5,&ExceptionCodes::typeinfo,0);
      }
      bVar2 = ComplexTypeInfo::getPreprocessed((ComplexTypeInfo *)baseDTValidator);
      if (bVar2) {
        baseDTValidator = (DatatypeValidator *)0x0;
      }
    }
  }
  else {
    bVar2 = XMLString::equals((XMLCh *)typeInfo_local,(XMLCh *)SchemaSymbols::fgURI_SCHEMAFORSCHEMA)
    ;
    if (bVar2) {
      _saveScope = getDatatypeValidator(this,(XMLCh *)typeInfo_local,uriStr_local);
      if (_saveScope == (DatatypeValidator *)0x0) {
        reportSchemaError(this,(DOMElement *)baseName_local,(XMLCh *)XMLUni::fgXMLErrDomain,0x2b,
                          localPart_local,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
        puVar5 = (undefined4 *)__cxa_allocate_exception(4);
        *puVar5 = 1;
        __cxa_throw(puVar5,&ExceptionCodes::typeinfo,0);
      }
    }
    else {
      impInfo._4_4_ =
           (*(this->fURIStringPool->super_XSerializable)._vptr_XSerializable[5])
                     (this->fURIStringPool,typeInfo_local);
      bVar2 = isImportingNS(this,impInfo._4_4_);
      if (!bVar2) {
        reportSchemaError(this,(DOMElement *)baseName_local,(XMLCh *)XMLUni::fgXMLErrDomain,0x8e,
                          (XMLCh *)typeInfo_local,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
        puVar5 = (undefined4 *)__cxa_allocate_exception(4);
        *puVar5 = 1;
        __cxa_throw(puVar5,&ExceptionCodes::typeinfo,0);
      }
      baseDTValidator =
           (DatatypeValidator *)
           getTypeInfoFromNS(this,(DOMElement *)baseName_local,(XMLCh *)typeInfo_local,uriStr_local)
      ;
      if (((ComplexTypeInfo *)baseDTValidator == (ComplexTypeInfo *)0x0) &&
         (_saveScope = getDatatypeValidator(this,(XMLCh *)typeInfo_local,uriStr_local),
         _saveScope == (DatatypeValidator *)0x0)) {
        this_00 = this->fSchemaInfo;
        uVar3 = (*(this->fURIStringPool->super_XSerializable)._vptr_XSerializable[5])
                          (this->fURIStringPool,typeInfo_local);
        fullBaseName = (XMLCh *)SchemaInfo::getImportInfo(this_00,uVar3);
        if (((SchemaInfo *)fullBaseName == (SchemaInfo *)0x0) ||
           (bVar2 = SchemaInfo::getProcessed((SchemaInfo *)fullBaseName), bVar2)) {
          reportSchemaError(this,(DOMElement *)baseName_local,(XMLCh *)XMLUni::fgXMLErrDomain,0x2b,
                            localPart_local,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
          puVar5 = (undefined4 *)__cxa_allocate_exception(4);
          *puVar5 = 1;
          __cxa_throw(puVar5,&ExceptionCodes::typeinfo,0);
        }
        uriId = 1;
        restoreSchemaInfo(this,(SchemaInfo *)fullBaseName,IMPORT,0xfffffffe);
      }
    }
  }
  if (((baseDTValidator == (DatatypeValidator *)0x0) && (_saveScope == (DatatypeValidator *)0x0)) &&
     (_saveScope = getDatatypeValidator(this,(XMLCh *)typeInfo_local,uriStr_local),
     _saveScope == (DatatypeValidator *)0x0)) {
    pDVar6 = SchemaInfo::getTopLevelComponent
                       (this->fSchemaInfo,0,(XMLCh *)SchemaSymbols::fgELT_COMPLEXTYPE,uriStr_local,
                        &this->fSchemaInfo);
    if (pDVar6 == (DOMElement *)0x0) {
      pDVar6 = SchemaInfo::getTopLevelComponent
                         (this->fSchemaInfo,1,(XMLCh *)SchemaSymbols::fgELT_SIMPLETYPE,uriStr_local,
                          &this->fSchemaInfo);
      if (pDVar6 == (DOMElement *)0x0) {
        if ((SchemaInfo *)baseComplexTypeInfo != this->fSchemaInfo) {
          restoreSchemaInfo(this,(SchemaInfo *)baseComplexTypeInfo,uriId,local_58);
        }
        reportSchemaError(this,(DOMElement *)baseName_local,(XMLCh *)XMLUni::fgXMLErrDomain,0x2b,
                          localPart_local,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
        puVar5 = (undefined4 *)__cxa_allocate_exception(4);
        *puVar5 = 1;
        __cxa_throw(puVar5,&ExceptionCodes::typeinfo,0);
      }
      _saveScope = traverseSimpleTypeDecl(this,pDVar6,true,0);
      if (_saveScope == (DatatypeValidator *)0x0) {
        if ((SchemaInfo *)baseComplexTypeInfo != this->fSchemaInfo) {
          restoreSchemaInfo(this,(SchemaInfo *)baseComplexTypeInfo,uriId,local_58);
        }
        reportSchemaError(this,(DOMElement *)baseName_local,(XMLCh *)XMLUni::fgXMLErrDomain,0x28,
                          (XMLCh *)typeInfo_local,uriStr_local,(XMLCh *)typeInfo_local,(XMLCh *)0x0)
        ;
        puVar5 = (undefined4 *)__cxa_allocate_exception(4);
        *puVar5 = 1;
        __cxa_throw(puVar5,&ExceptionCodes::typeinfo,0);
      }
    }
    else {
      uVar3 = traverseComplexTypeDecl(this,pDVar6,true,(XMLCh *)0x0);
      this_01 = this->fComplexTypeRegistry;
      iVar4 = (*(this->fStringPool->super_XSerializable)._vptr_XSerializable[10])
                        (this->fStringPool,(ulong)uVar3);
      baseDTValidator =
           (DatatypeValidator *)
           RefHashTableOf<xercesc_4_0::ComplexTypeInfo,_xercesc_4_0::StringHasher>::get
                     (this_01,(void *)CONCAT44(extraout_var,iVar4));
    }
  }
  if ((SchemaInfo *)baseComplexTypeInfo != this->fSchemaInfo) {
    restoreSchemaInfo(this,(SchemaInfo *)baseComplexTypeInfo,uriId,local_58);
  }
  ComplexTypeInfo::setBaseComplexTypeInfo
            ((ComplexTypeInfo *)saveInfo,(ComplexTypeInfo *)baseDTValidator);
  ComplexTypeInfo::setBaseDatatypeValidator((ComplexTypeInfo *)saveInfo,_saveScope);
  return;
}

Assistant:

void TraverseSchema::processBaseTypeInfo(const DOMElement* const elem,
                                         const XMLCh* const baseName,
                                         const XMLCh* const localPart,
                                         const XMLCh* const uriStr,
                                         ComplexTypeInfo* const typeInfo) {

    SchemaInfo*          saveInfo = fSchemaInfo;
    ComplexTypeInfo*     baseComplexTypeInfo = 0;
    DatatypeValidator*   baseDTValidator = 0;
    SchemaInfo::ListType infoType = SchemaInfo::INCLUDE;
    unsigned int         saveScope = fCurrentScope;

    // check if the base type is from another schema
    if (!XMLString::equals(uriStr, fTargetNSURIString)) {

        // check for datatype validator if it's schema for schema URI
        if (XMLString::equals(uriStr, SchemaSymbols::fgURI_SCHEMAFORSCHEMA)) {

            baseDTValidator = getDatatypeValidator(uriStr, localPart);

            if (!baseDTValidator) {
                reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::BaseTypeNotFound, baseName);
                throw TraverseSchema::InvalidComplexTypeInfo;
            }
        }
        else {

            // Make sure that we have an explicit import statement.
            // Clause 4 of Schema Representation Constraint:
            // http://www.w3.org/TR/xmlschema-1/#src-resolve
            unsigned int uriId = fURIStringPool->addOrFind(uriStr);

            if (!isImportingNS(uriId)) {

                reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::InvalidNSReference, uriStr);
                throw TraverseSchema::InvalidComplexTypeInfo;
            }

            baseComplexTypeInfo = getTypeInfoFromNS(elem, uriStr, localPart);

            if (!baseComplexTypeInfo) {

              baseDTValidator = getDatatypeValidator(uriStr, localPart);

              if (!baseDTValidator)
              {
                SchemaInfo* impInfo = fSchemaInfo->getImportInfo(fURIStringPool->addOrFind(uriStr));

                if (!impInfo || impInfo->getProcessed())
                {
                    reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::BaseTypeNotFound, baseName);
                    throw TraverseSchema::InvalidComplexTypeInfo;
                }

                infoType = SchemaInfo::IMPORT;
                restoreSchemaInfo(impInfo, infoType);
              }
            }
        }
    }
    else {

        fBuffer.set(uriStr);
        fBuffer.append(chComma);
        fBuffer.append(localPart);

        // assume the base is a complexType and try to locate the base type first
        const XMLCh* fullBaseName = fBuffer.getRawBuffer();
        baseComplexTypeInfo = fComplexTypeRegistry->get(fullBaseName);

        // Circular check
        if (baseComplexTypeInfo) {

            if (fCurrentTypeNameStack->containsElement(fStringPool->addOrFind(fullBaseName), fCircularCheckIndex)) {

                reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::NoCircularDefinition, fullBaseName);
                throw TraverseSchema::InvalidComplexTypeInfo;
            }
            else if (fCurrentTypeNameStack->containsElement(fStringPool->addOrFind(fullBaseName))) {

                typeInfo->setBaseComplexTypeInfo(baseComplexTypeInfo);
                throw TraverseSchema::RecursingElement;
            }
            else if (baseComplexTypeInfo->getPreprocessed()) {
                baseComplexTypeInfo = 0;
            }
        }
    }

    // if not found, 2 possibilities:
    //           1: ComplexType in question has not been compiled yet;
    //           2: base is SimpleType;
    if (!baseComplexTypeInfo && !baseDTValidator) {

        baseDTValidator = getDatatypeValidator(uriStr, localPart);

        if (baseDTValidator == 0) {

            DOMElement* baseTypeNode = fSchemaInfo->getTopLevelComponent(SchemaInfo::C_ComplexType,
                SchemaSymbols::fgELT_COMPLEXTYPE, localPart, &fSchemaInfo);

            if (baseTypeNode != 0) {

                int baseTypeSymbol = traverseComplexTypeDecl(baseTypeNode);
                baseComplexTypeInfo = fComplexTypeRegistry->get(fStringPool->getValueForId(baseTypeSymbol));
            }
            else {

                baseTypeNode = fSchemaInfo->getTopLevelComponent(SchemaInfo::C_SimpleType,
                    SchemaSymbols::fgELT_SIMPLETYPE, localPart, &fSchemaInfo);

                if (baseTypeNode != 0) {

                    baseDTValidator = traverseSimpleTypeDecl(baseTypeNode);

                    if (baseDTValidator == 0)  {

                        // restore schema information, if necessary
                        if (saveInfo != fSchemaInfo) {
                            restoreSchemaInfo(saveInfo, infoType, saveScope);
                        }

                        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::TypeNotFound, uriStr, localPart, uriStr);
                        throw TraverseSchema::InvalidComplexTypeInfo;
                    }
                }
                else {

                    // restore schema information, if necessary
                    if (saveInfo != fSchemaInfo) {
                        restoreSchemaInfo(saveInfo, infoType, saveScope);
                    }
                    reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::BaseTypeNotFound, baseName);
                    throw TraverseSchema::InvalidComplexTypeInfo;
                }
            }
        }
    } // end if

    // restore schema information, if necessary
    if (saveInfo != fSchemaInfo) {
        restoreSchemaInfo(saveInfo, infoType, saveScope);
    }

    typeInfo->setBaseComplexTypeInfo(baseComplexTypeInfo);
    typeInfo->setBaseDatatypeValidator(baseDTValidator);
}